

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roboteq.h
# Opt level: O0

int SetAllPWMsRoboteq(ROBOTEQ *pRoboteq,int *selectedchannels,int *pws)

{
  int iVar1;
  bool local_4d;
  int local_4c;
  int local_48;
  int local_44;
  uint local_40;
  int local_3c;
  int res;
  int nbselectedchannels;
  int pws_tmp [3];
  int channel;
  int *pws_local;
  int *selectedchannels_local;
  ROBOTEQ *pRoboteq_local;
  
  stack0xffffffffffffffd8 = pws;
  local_40 = 0;
  local_3c = 0;
  _res = *(undefined8 *)pws;
  pws_tmp[0] = pws[2];
  for (pws_tmp[1] = 0; pws_tmp[1] < 3; pws_tmp[1] = pws_tmp[1] + 1) {
    if (selectedchannels[pws_tmp[1]] != 0) {
      if (pRoboteq->bProportionalPWs[pws_tmp[1]] == 0) {
        (&res)[pws_tmp[1]] =
             (int)(pRoboteq->CoefPWs[pws_tmp[1]] * (double)((&res)[pws_tmp[1]] + -0x5dc)) + 0x5dc;
      }
      else {
        (&res)[pws_tmp[1]] =
             (int)(pRoboteq->CoefPWs[pws_tmp[1]] * (double)((&res)[pws_tmp[1]] + -0x5dc));
        if ((&res)[pws_tmp[1]] < 0) {
          (&res)[pws_tmp[1]] =
               pRoboteq->MidPWs[pws_tmp[1]] +
               ((&res)[pws_tmp[1]] * (pRoboteq->MinPWs[pws_tmp[1]] - pRoboteq->MidPWs[pws_tmp[1]]))
               / -500;
        }
        else {
          (&res)[pws_tmp[1]] =
               pRoboteq->MidPWs[pws_tmp[1]] +
               ((&res)[pws_tmp[1]] * (pRoboteq->MaxPWs[pws_tmp[1]] - pRoboteq->MidPWs[pws_tmp[1]]))
               / 500;
        }
      }
      if ((&res)[pws_tmp[1]] < pRoboteq->MaxPWs[pws_tmp[1]]) {
        local_44 = (&res)[pws_tmp[1]];
      }
      else {
        local_44 = pRoboteq->MaxPWs[pws_tmp[1]];
      }
      if (pRoboteq->MinPWs[pws_tmp[1]] < local_44) {
        if ((&res)[pws_tmp[1]] < pRoboteq->MaxPWs[pws_tmp[1]]) {
          local_48 = (&res)[pws_tmp[1]];
        }
        else {
          local_48 = pRoboteq->MaxPWs[pws_tmp[1]];
        }
        local_4c = local_48;
      }
      else {
        local_4c = pRoboteq->MinPWs[pws_tmp[1]];
      }
      (&res)[pws_tmp[1]] = local_4c;
      iVar1 = (&res)[pws_tmp[1]] - pRoboteq->LastPWs[pws_tmp[1]];
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      if (pRoboteq->ThresholdPWs[pws_tmp[1]] <= iVar1) {
        local_4d = true;
        if (local_40 == 0) {
          iVar1 = SetCommandRoboteq(pRoboteq,0,pws_tmp[1] + 1,
                                    (((&res)[pws_tmp[1]] + -0x5dc) * 2000) / 1000);
          local_4d = iVar1 != 0;
        }
        local_40 = (uint)local_4d;
        local_3c = local_3c + 1;
      }
    }
  }
  if (local_3c == 0) {
    pRoboteq_local._4_4_ = 0;
  }
  else if (local_40 == 0) {
    for (pws_tmp[1] = 0; pws_tmp[1] < 3; pws_tmp[1] = pws_tmp[1] + 1) {
      if (selectedchannels[pws_tmp[1]] != 0) {
        iVar1 = (&res)[pws_tmp[1]] - pRoboteq->LastPWs[pws_tmp[1]];
        if (iVar1 < 1) {
          iVar1 = -iVar1;
        }
        if (pRoboteq->ThresholdPWs[pws_tmp[1]] <= iVar1) {
          pRoboteq->LastPWs[pws_tmp[1]] = (&res)[pws_tmp[1]];
        }
      }
    }
    pRoboteq_local._4_4_ = 0;
  }
  else {
    pRoboteq_local._4_4_ = local_40;
  }
  return pRoboteq_local._4_4_;
}

Assistant:

inline int SetAllPWMsRoboteq(ROBOTEQ* pRoboteq, int* selectedchannels, int* pws)
{
	int channel = 0;
	int pws_tmp[NB_CHANNELS_PWM_ROBOTEQ];
	int nbselectedchannels = 0;
	int res = EXIT_SUCCESS;

	nbselectedchannels = 0;

	memcpy(pws_tmp, pws, sizeof(pws_tmp));

	for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
	{
		if (!selectedchannels[channel]) continue;

		if (pRoboteq->bProportionalPWs[channel])
		{
			pws_tmp[channel] = (int)(pRoboteq->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_ROBOTEQ));
			if (pws_tmp[channel] >= 0)
				pws_tmp[channel] = pRoboteq->MidPWs[channel]+pws_tmp[channel]*(pRoboteq->MaxPWs[channel]-pRoboteq->MidPWs[channel])
				/(DEFAULT_MAX_PW_ROBOTEQ-DEFAULT_MID_PW_ROBOTEQ);
			else
				pws_tmp[channel] = pRoboteq->MidPWs[channel]+pws_tmp[channel]*(pRoboteq->MinPWs[channel]-pRoboteq->MidPWs[channel])
				/(DEFAULT_MIN_PW_ROBOTEQ-DEFAULT_MID_PW_ROBOTEQ);
		}
		else
		{
			pws_tmp[channel] = DEFAULT_MID_PW_ROBOTEQ+(int)(pRoboteq->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_ROBOTEQ));
		}

		pws_tmp[channel] = max(min(pws_tmp[channel], pRoboteq->MaxPWs[channel]), pRoboteq->MinPWs[channel]);
		//pws_tmp[channel] = max(min(pws_tmp[channel], DEFAULT_ABSOLUTE_MAX_PW_ROBOTEQ), DEFAULT_ABSOLUTE_MIN_PW_ROBOTEQ);

		// The requested PWM is only applied if it is slightly different from the current value.
		if (abs(pws_tmp[channel]-pRoboteq->LastPWs[channel]) < pRoboteq->ThresholdPWs[channel]) continue;

		//printf("%d %d %d %d %d\n", channel, pws_tmp[channel], pRoboteq->LastPWs[channel], abs(pws_tmp[channel]-pRoboteq->LastPWs[channel]), pRoboteq->ThresholdPWs[channel]);
		
		res = (res || SetCommandRoboteq(pRoboteq, _GO_ROBOTEQ, channel+1, 2*(pws_tmp[channel]-DEFAULT_MID_PW_ROBOTEQ)*(DEFAULT_MAX_PW_ROBOTEQ-DEFAULT_MIN_PW_ROBOTEQ)/1000));

		nbselectedchannels++;
	}

	if (nbselectedchannels == 0) return EXIT_SUCCESS;
	
	if (res != EXIT_SUCCESS) return res;

	for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
	{
		if (!selectedchannels[channel]) continue;

		// The requested PWM should have been only applied if it was slightly different from the current value.
		if (abs(pws_tmp[channel]-pRoboteq->LastPWs[channel]) < pRoboteq->ThresholdPWs[channel]) continue;

		// Update last known value.
		pRoboteq->LastPWs[channel] = pws_tmp[channel];
	}

	return EXIT_SUCCESS;
}